

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall luna::SemanticAnalysisVisitor::DeleteCurrentFunction(SemanticAnalysisVisitor *this)

{
  undefined8 *puVar1;
  long in_RDI;
  LexicalFunction *function;
  SemanticAnalysisVisitor *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    DeleteBlocks(in_stack_ffffffffffffffe0);
    puVar1 = *(undefined8 **)(in_RDI + 0x10);
    *(undefined8 *)(in_RDI + 0x10) = *puVar1;
    if (puVar1 != (undefined8 *)0x0) {
      operator_delete(puVar1);
    }
    return;
  }
  __assert_fail("current_function_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                ,0xb3,"void luna::SemanticAnalysisVisitor::DeleteCurrentFunction()");
}

Assistant:

void DeleteCurrentFunction()
        {
            assert(current_function_);
            // delete all blocks in current function
            DeleteBlocks();

            // delete current function
            auto function = current_function_;
            current_function_ = function->parent_;
            delete function;
        }